

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateAddField
          (KotlinKMPGenerator *this,string *field_pos,FieldDef *field,CodeWriter *writer,
          IDLOptions *options)

{
  function<void_()> local_200;
  allocator<char> local_1d9;
  string local_1d8;
  function<void_()> local_1b8;
  allocator<char> local_191;
  string local_190;
  undefined1 local_170 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params;
  string local_148;
  allocator<char> local_121;
  string local_120;
  undefined1 local_100 [8];
  string signature;
  anon_class_32_4_43b17e1f content;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> secondArg;
  string field_type;
  IDLOptions *options_local;
  CodeWriter *writer_local;
  FieldDef *field_local;
  string *field_pos_local;
  KotlinKMPGenerator *this_local;
  
  GenType_abi_cxx11_((string *)((long)&secondArg.field_2 + 8),this,&(field->value).type);
  Namer::Variable(&local_b0,&(this->namer_).super_Namer,(string *)field);
  std::operator+(&local_90,&local_b0,": ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 &local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&secondArg.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  signature.field_2._8_8_ = field;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"add",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"",(allocator<char> *)(params.field_2._M_local_buf + 0xf));
  IdlNamer::LegacyKotlinMethod((string *)local_100,&this->namer_,&local_120,field,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)(params.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                 "builder: FlatBufferBuilder, ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  if ((field->key & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"",&local_1d9);
    std::function<void()>::
    function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateAddField(std::__cxx11::string,flatbuffers::FieldDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_&,void>
              ((function<void()> *)&local_200,
               (anon_class_32_4_43b17e1f *)((long)&signature.field_2 + 8));
    GenerateFunOneLine(writer,(string *)local_100,(string *)local_170,&local_1d8,&local_200,
                       (bool)(options->gen_jvmstatic & 1));
    std::function<void_()>::~function(&local_200);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"",&local_191);
    std::function<void()>::
    function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateAddField(std::__cxx11::string,flatbuffers::FieldDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_&,void>
              ((function<void()> *)&local_1b8,
               (anon_class_32_4_43b17e1f *)((long)&signature.field_2 + 8));
    GenerateFun(writer,(string *)local_100,(string *)local_170,&local_190,&local_1b8,
                (bool)(options->gen_jvmstatic & 1));
    std::function<void_()>::~function(&local_1b8);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
  }
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(secondArg.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GenerateAddField(std::string field_pos, FieldDef &field,
                        CodeWriter &writer, const IDLOptions options) const {
    auto field_type = GenType(field.value.type);
    auto secondArg = namer_.Variable(field.name) + ": " + field_type;

    auto content = [&]() {
      auto method = GenMethod(field.value.type);
      auto default_value = GenDefaultBufferValue(field);
      auto field_param = namer_.Field(field);
      if (IsEnum(field.value.type) || IsStruct(field.value.type)) {
        field_param += ".value";
      }

      writer.SetValue("field_name", namer_.Field(field));
      writer.SetValue("field_param", field_param);
      writer.SetValue("method_name", method);
      writer.SetValue("pos", field_pos);
      writer.SetValue("default", default_value);

      if (field.key) {
        // field has key attribute, so always need to exist
        // even if its value is equal to default.
        // Generated code will bypass default checking
        // resulting in { builder.addShort(name); slot(id); }
        writer += "builder.add{{method_name}}({{field_name}})";
        writer += "builder.slot({{pos}})";
      } else {
        writer += "builder.add{{method_name}}({{pos}}, \\";
        writer += "{{field_param}}, {{default}})";
      }
    };
    auto signature = namer_.LegacyKotlinMethod("add", field, "");
    auto params = "builder: FlatBufferBuilder, " + secondArg;
    if (field.key) {
      GenerateFun(writer, signature, params, "", content,
                  options.gen_jvmstatic);
    } else {
      GenerateFunOneLine(writer, signature, params, "", content,
                         options.gen_jvmstatic);
    }
  }